

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

int error_get_description(ERROR_HANDLE error,char **description_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  int iVar3;
  uint32_t item_count;
  uint local_1c;
  
  if (error == (ERROR_HANDLE)0x0) {
    iVar3 = 0x1c3;
  }
  else {
    iVar1 = amqpvalue_get_composite_item_count(error->composite_value,&local_1c);
    iVar3 = 0x1cb;
    if ((iVar1 == 0) && (iVar3 = 0x1d1, 1 < local_1c)) {
      value = amqpvalue_get_composite_item_in_place(error->composite_value,1);
      iVar3 = 0x1d9;
      if ((value != (AMQP_VALUE)0x0) && (AVar2 = amqpvalue_get_type(value), AVar2 != AMQP_TYPE_NULL)
         ) {
        iVar1 = amqpvalue_get_string(value,description_value);
        iVar3 = 0x1e0;
        if (iVar1 == 0) {
          iVar3 = 0;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int error_get_description(ERROR_HANDLE error, const char** description_value)
{
    int result;

    if (error == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        ERROR_INSTANCE* error_instance = (ERROR_INSTANCE*)error;
        if (amqpvalue_get_composite_item_count(error_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 1)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(error_instance->composite_value, 1);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_string(item_value, description_value);
                    if (get_single_value_result != 0)
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}